

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.h
# Opt level: O1

BOOLEAN __thiscall BVStatic<16UL>::Test(BVStatic<16UL> *this,BVIndex i)

{
  AssertRange(this,i);
  AssertRange(this,i);
  BVUnitT<unsigned_long>::AssertRange(i & 0x3f);
  return (this[i >> 6].data[0].word >> ((ulong)i & 0x3f) & 1) != 0;
}

Assistant:

BOOLEAN Test(BVIndex i) const
    {
        AssertRange(i);
        return this->BitsFromIndex(i)->Test(BVUnit::Offset(i));
    }